

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InterpolateAtOffsetCase::genVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  ostream *poVar1;
  RenderContext *pRVar2;
  char *local_210;
  ContextType local_1d4;
  string local_1d0;
  char *local_1b0;
  char *qualifier;
  ostringstream local_198 [8];
  ostringstream buf;
  int numTargetSamples_local;
  InterpolateAtOffsetCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"${GLSL_VERSION_DECL}\n");
  poVar1 = std::operator<<(poVar1,"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}");
  std::operator<<(poVar1,"in highp vec4 a_position;\n");
  if (((*(int *)((long)this + 0x128) == 0) || (*(int *)((long)this + 0x128) == 1)) ||
     (*(int *)((long)this + 0x128) == 2)) {
    if (*(int *)((long)this + 0x128) == 1) {
      local_210 = "centroid ";
    }
    else {
      local_210 = "";
      if (*(int *)((long)this + 0x128) == 2) {
        local_210 = "sample ";
      }
    }
    local_1b0 = local_210;
    poVar1 = std::operator<<((ostream *)local_198,local_210);
    poVar1 = std::operator<<(poVar1,"out highp vec2 v_screenPosition;\n");
    poVar1 = std::operator<<(poVar1,local_1b0);
    std::operator<<(poVar1,"out highp vec2 v_offset;\n");
  }
  else if (*(int *)((long)this + 0x128) == 3) {
    poVar1 = std::operator<<((ostream *)local_198,"out highp vec2[2] v_screenPosition;\n");
    std::operator<<(poVar1,"out highp vec2 v_offset;\n");
  }
  poVar1 = std::operator<<((ostream *)local_198,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  std::operator<<(poVar1,"\tgl_Position = a_position;\n");
  if (*(int *)((long)this + 0x128) == 3) {
    poVar1 = std::operator<<((ostream *)local_198,
                             "\tv_screenPosition[0] = a_position.xy; // not used\n\tv_screenPosition[1] = (a_position.xy + vec2(1.0, 1.0)) / 2.0 * vec2("
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x20);
    poVar1 = std::operator<<(poVar1,".0, ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x20);
    std::operator<<(poVar1,".0);\n");
  }
  else {
    poVar1 = std::operator<<((ostream *)local_198,
                             "\tv_screenPosition = (a_position.xy + vec2(1.0, 1.0)) / 2.0 * vec2(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x20);
    poVar1 = std::operator<<(poVar1,".0, ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x20);
    std::operator<<(poVar1,".0);\n");
  }
  poVar1 = std::operator<<((ostream *)local_198,"\tv_offset = a_position.xy * 0.5f;\n");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::ostringstream::str();
  pRVar2 = Context::getRenderContext(*(Context **)((long)this + 0x70));
  local_1d4.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1d0,&local_1d4);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string InterpolateAtOffsetCase::genVertexSource (int numTargetSamples) const
{
	DE_UNREF(numTargetSamples);

	std::ostringstream buf;
	buf << "${GLSL_VERSION_DECL}\n"
		<< "${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}"
		<< "in highp vec4 a_position;\n";

	if (m_testType == TEST_QUALIFIER_NONE || m_testType == TEST_QUALIFIER_CENTROID || m_testType == TEST_QUALIFIER_SAMPLE)
	{
		const char* const qualifier = (m_testType == TEST_QUALIFIER_CENTROID) ? ("centroid ") : (m_testType == TEST_QUALIFIER_SAMPLE) ? ("sample ") : ("");
		buf << qualifier << "out highp vec2 v_screenPosition;\n"
			<< qualifier << "out highp vec2 v_offset;\n";
	}
	else if (m_testType == TEST_ARRAY_ELEMENT)
	{
		buf << "out highp vec2[2] v_screenPosition;\n"
			<< "out highp vec2 v_offset;\n";
	}
	else
		DE_ASSERT(false);

	buf	<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = a_position;\n";

	if (m_testType != TEST_ARRAY_ELEMENT)
		buf	<< "	v_screenPosition = (a_position.xy + vec2(1.0, 1.0)) / 2.0 * vec2(" << (int)RENDER_SIZE << ".0, " << (int)RENDER_SIZE << ".0);\n";
	else
		buf	<< "	v_screenPosition[0] = a_position.xy; // not used\n"
				"	v_screenPosition[1] = (a_position.xy + vec2(1.0, 1.0)) / 2.0 * vec2(" << (int)RENDER_SIZE << ".0, " << (int)RENDER_SIZE << ".0);\n";

	buf	<< "	v_offset = a_position.xy * 0.5f;\n"
		<< "}\n";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}